

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ly_ctx_unset_options(ly_ctx *ctx,uint16_t option)

{
  lysc_ext_instance *local_70;
  void *local_60;
  uint32_t local_4c;
  lys_module *plStack_48;
  uint32_t index;
  lys_module *mod;
  lysc_node *root;
  lysc_ext_instance *ext;
  uint64_t v;
  uint64_t u;
  ly_ctx *plStack_18;
  uint16_t option_local;
  ly_ctx *ctx_local;
  
  u._6_2_ = option;
  plStack_18 = ctx;
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_unset_options");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if ((option & 4) == 0) {
    if (((ctx->flags & 0x400) != 0) && ((option & 0x400) != 0)) {
      lyht_free(ctx->leafref_links_ht,ly_ctx_ht_leafref_links_rec_free);
      plStack_18->leafref_links_ht = (ly_ht *)0x0;
    }
    if (((plStack_18->flags & 0x40) != 0) && ((u._6_2_ & 0x40) != 0)) {
      local_4c = 0;
      while (plStack_48 = ly_ctx_get_module_iter(plStack_18,&local_4c),
            plStack_48 != (lys_module *)0x0) {
        if (plStack_48->compiled != (lysc_module *)0x0) {
          lysc_module_dfs_full(plStack_48,lysc_node_clear_priv_dfs_cb,(void *)0x0);
          v = 0;
          while( true ) {
            if (plStack_48->compiled->exts == (lysc_ext_instance *)0x0) {
              local_60 = (void *)0x0;
            }
            else {
              local_60 = plStack_48->compiled->exts[-1].compiled;
            }
            if (local_60 <= v) break;
            root = (lysc_node *)(plStack_48->compiled->exts + v);
            ext = (lysc_ext_instance *)0x0;
            while( true ) {
              if (root->ref == (char *)0x0) {
                local_70 = (lysc_ext_instance *)0x0;
              }
              else {
                local_70 = *(lysc_ext_instance **)(root->ref + -8);
              }
              if (local_70 <= ext) break;
              if ((*(uint *)(root->ref + (long)ext * 0x10) & 0x7760) != 0) {
                for (mod = (lys_module *)**(undefined8 **)(root->ref + (long)ext * 0x10 + 8);
                    mod != (lys_module *)0x0; mod = (lys_module *)mod->ns) {
                  lysc_tree_dfs_full((lysc_node *)mod,lysc_node_clear_priv_dfs_cb,(void *)0x0);
                }
              }
              ext = (lysc_ext_instance *)((long)&ext->def + 1);
            }
            v = v + 1;
          }
        }
      }
    }
    plStack_18->flags = plStack_18->flags & (u._6_2_ ^ 0xffff);
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","option","ly_ctx_unset_options");
    ctx_local._4_4_ = LY_EINVAL;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_options(struct ly_ctx *ctx, uint16_t option)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const struct lysc_ext_instance *ext;
    struct lysc_node *root;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);
    LY_CHECK_ERR_RET(option & LY_CTX_NO_YANGLIBRARY, LOGARG(ctx, option), LY_EINVAL);

    if ((ctx->flags & LY_CTX_LEAFREF_LINKING) && (option & LY_CTX_LEAFREF_LINKING)) {
        lyht_free(ctx->leafref_links_ht, ly_ctx_ht_leafref_links_rec_free);
        ctx->leafref_links_ht = NULL;
    }

    if ((ctx->flags & LY_CTX_SET_PRIV_PARSED) && (option & LY_CTX_SET_PRIV_PARSED)) {
        struct lys_module *mod;
        uint32_t index;

        index = 0;
        while ((mod = ly_ctx_get_module_iter(ctx, &index))) {
            if (!mod->compiled) {
                continue;
            }

            /* set NULL for all ::lysc_node.priv pointers in module */
            lysc_module_dfs_full(mod, lysc_node_clear_priv_dfs_cb, NULL);

            /* set NULL for all ::lysc_node.priv pointers in compiled extension instances */
            LY_ARRAY_FOR(mod->compiled->exts, u) {
                ext = &mod->compiled->exts[u];
                LY_ARRAY_FOR(ext->substmts, v) {
                    if (ext->substmts[v].stmt & LY_STMT_DATA_NODE_MASK) {
                        LY_LIST_FOR(*ext->substmts[v].storage_p, root) {
                            lysc_tree_dfs_full(root, lysc_node_clear_priv_dfs_cb, NULL);
                        }
                    }
                }
            }
        }
    }

    /* unset the option(s) */
    ctx->flags &= ~option;

    return LY_SUCCESS;
}